

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O3

strong_type<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
* __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::map<____C_A_T_C_H____T_E_S_T____28()::__1&>
          (strong_type<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
           *__return_storage_ptr__,
          impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
          *this,anon_class_1_0_00000001 *fn)

{
  _Uninitialized<double,_true> _Var1;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar2;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> *pvVar3;
  strong_type<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
  *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_class_1_0_00000001 local_39;
  _Variadic_union<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  byte local_18;
  
  if (this[0x20] ==
      (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
       )0x0) {
    pvVar3 = std::get<0ul,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    local_38._M_first._M_storage = (_Uninitialized<double,_true>)((double)*pvVar3 * 1.5);
    local_18 = 0;
    std::__detail::__variant::
    _Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
    psVar4 = (strong_type<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
              *)(*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr[local_18]._M_data)
                          (&local_39,
                           (variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38);
  }
  else {
    pvVar2 = std::get<1ul,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    local_38._M_first._M_storage = (_Uninitialized<double,_true>)((long)&local_38 + 0x10);
    _Var1._M_storage = (double)(pvVar2->_M_dataplus)._M_p;
    paVar5 = &pvVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var1._M_storage == paVar5) {
      local_38._16_8_ = paVar5->_M_allocated_capacity;
      local_38._24_8_ = *(undefined8 *)((long)&pvVar2->field_2 + 8);
    }
    else {
      local_38._16_8_ = paVar5->_M_allocated_capacity;
      local_38._M_first._M_storage = (_Uninitialized<double,_true>)_Var1._M_storage;
    }
    local_38._8_8_ = pvVar2->_M_string_length;
    (pvVar2->_M_dataplus)._M_p = (pointer)paVar5;
    pvVar2->_M_string_length = 0;
    (pvVar2->field_2)._M_local_buf[0] = '\0';
    local_18 = 1;
    std::__detail::__variant::
    _Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
    psVar4 = (strong_type<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
              *)(*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr[local_18]._M_data)
                          (&local_39,
                           (variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38);
  }
  return psVar4;
}

Assistant:

constexpr decltype(auto) map(Fn&& fn) &&
      {
        return _impl::map(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }